

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O3

void stripctrl_locale_BinarySink_write(BinarySink *bs,void *vp,size_t len)

{
  BinarySink **__s;
  BinarySink **scc;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var1;
  BinarySink *pBVar2;
  char *pcVar3;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var4;
  ulong uVar5;
  size_t __n;
  wchar_t local_48;
  wchar_t local_44;
  char *local_40;
  BinarySink *local_38;
  
  scc = &bs[-7].binarysink_;
  pcVar3 = setlocale(0,(char *)0x0);
  local_40 = dupstr(pcVar3);
  setlocale(0,"");
  p_Var4 = bs[-3].writefmtv;
  if (p_Var4 != (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
    __s = &bs[-6].binarysink_;
    do {
      uVar5 = 0x40 - (long)p_Var4;
      __n = len;
      if (uVar5 < len) {
        __n = uVar5;
      }
      memcpy(p_Var4 + (long)__s,vp,__n);
      local_38 = bs[-7].binarysink_;
      p_Var4 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)
               mbrtowc(&local_48,(char *)__s,(size_t)(bs[-3].writefmtv + __n),(mbstate_t *)scc);
      if (p_Var4 != (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0xffffffffffffffff) {
        if (p_Var4 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
          stripctrl_locale_put_wc((StripCtrlCharsImpl *)scc,L'\0');
          goto LAB_0013679d;
        }
        if (p_Var4 != (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0xfffffffffffffffe) {
          stripctrl_locale_put_wc((StripCtrlCharsImpl *)scc,local_48);
          goto LAB_001367a2;
        }
        bs[-7].binarysink_ = local_38;
        if (bs[-3].writefmtv != (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
          if (uVar5 < len) {
            __assert_fail("to_copy == len",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                          ,0x15f,
                          "void stripctrl_locale_BinarySink_write(BinarySink *, const void *, size_t)"
                         );
          }
          len = (size_t)(bs[-3].writefmtv + __n);
          goto LAB_00136891;
        }
        uVar5 = 0;
LAB_001367e0:
        vp = (void *)((long)vp + uVar5);
        len = len - uVar5;
        bs[-3].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
        break;
      }
      *scc = (BinarySink *)0x0;
LAB_0013679d:
      p_Var4 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x1;
LAB_001367a2:
      p_Var1 = bs[-3].writefmtv;
      uVar5 = (long)p_Var4 - (long)p_Var1;
      if (p_Var1 <= p_Var4) {
        if (len < uVar5) {
          __assert_fail("consumed_from_main_string <= len",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                        ,0x14d,
                        "void stripctrl_locale_BinarySink_write(BinarySink *, const void *, size_t)"
                       );
        }
        goto LAB_001367e0;
      }
      bs[-3].writefmtv = p_Var1 + -(long)p_Var4;
      memmove(__s,p_Var4 + (long)__s,(size_t)(p_Var1 + -(long)p_Var4));
      p_Var4 = bs[-3].writefmtv;
    } while (p_Var4 != (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0);
  }
  if ((_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)len ==
      (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
    len = 0;
  }
  else {
    do {
      pBVar2 = *scc;
      p_Var4 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)
               mbrtowc(&local_44,(char *)vp,len,(mbstate_t *)scc);
      if (p_Var4 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0xffffffffffffffff) {
        *scc = (BinarySink *)0x0;
LAB_0013684b:
        p_Var4 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x1;
      }
      else {
        if (p_Var4 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
          stripctrl_locale_put_wc((StripCtrlCharsImpl *)scc,L'\0');
          goto LAB_0013684b;
        }
        if (p_Var4 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0xfffffffffffffffe) {
          *scc = pBVar2;
          if ((_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x40 < len) {
            __assert_fail("len <= SCC_BUFSIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                          ,0x184,
                          "void stripctrl_locale_BinarySink_write(BinarySink *, const void *, size_t)"
                         );
          }
          goto LAB_00136882;
        }
        stripctrl_locale_put_wc((StripCtrlCharsImpl *)scc,local_44);
      }
      if (len < p_Var4) {
        __assert_fail("consumed <= len",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                      ,0x17b,
                      "void stripctrl_locale_BinarySink_write(BinarySink *, const void *, size_t)");
      }
      vp = (void *)((long)vp + (long)p_Var4);
      len = len + -(long)p_Var4;
    } while ((_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)len !=
             (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0);
    len = 0;
  }
LAB_00136882:
  memcpy(&bs[-6].binarysink_,vp,len);
LAB_00136891:
  pcVar3 = local_40;
  bs[-3].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)len;
  setlocale(0,local_40);
  safefree(pcVar3);
  return;
}

Assistant:

static void stripctrl_locale_BinarySink_write(
    BinarySink *bs, const void *vp, size_t len)
{
    StripCtrlChars *sccpub = BinarySink_DOWNCAST(bs, StripCtrlChars);
    StripCtrlCharsImpl *scc =
        container_of(sccpub, StripCtrlCharsImpl, public);
    const char *p = (const char *)vp;

    char *previous_locale = dupstr(setlocale(LC_CTYPE, NULL));
    setlocale(LC_CTYPE, "");

    /*
     * Deal with any partial multibyte character buffered from last
     * time.
     */
    while (scc->buflen > 0) {
        size_t to_copy = SCC_BUFSIZE - scc->buflen;
        if (to_copy > len)
            to_copy = len;

        memcpy(scc->buf + scc->buflen, p, to_copy);
        size_t consumed = stripctrl_locale_try_consume(
            scc, scc->buf, scc->buflen + to_copy);

        if (consumed >= scc->buflen) {
            /*
             * We've consumed a multibyte character that includes all
             * the data buffered from last time. So we can clear our
             * buffer and move on to processing the main input string
             * in situ, having first discarded whatever initial
             * segment of it completed our previous character.
             */
            size_t consumed_from_main_string = consumed - scc->buflen;
            assert(consumed_from_main_string <= len);
            p += consumed_from_main_string;
            len -= consumed_from_main_string;
            scc->buflen = 0;
            break;
        }

        if (consumed == 0) {
            /*
             * If we didn't manage to consume anything, i.e. the whole
             * buffer contains an incomplete sequence, it had better
             * be because our entire input string _this_ time plus
             * whatever leftover data we had from _last_ time still
             * comes to less than SCC_BUFSIZE. In other words, we've
             * already copied all the new data on to the end of our
             * buffer, and it still hasn't helped. So increment buflen
             * to reflect the new data, and return.
             */
            assert(to_copy == len);
            scc->buflen += to_copy;
            goto out;
        }

        /*
         * Otherwise, we've somehow consumed _less_ data than we had
         * buffered, and yet we weren't able to consume that data in
         * the last call to this function. That sounds impossible, but
         * I can think of one situation in which it could happen: if
         * we had an incomplete MB sequence last time, and now more
         * data has arrived, it turns out to be an _illegal_ one, so
         * we consume one byte in the hope of resynchronising.
         *
         * Anyway, in this case we move the buffer up and go back
         * round this initial loop.
         */
        scc->buflen -= consumed;
        memmove(scc->buf, scc->buf + consumed, scc->buflen);
    }

    /*
     * Now charge along the main string.
     */
    while (len > 0) {
        size_t consumed = stripctrl_locale_try_consume(scc, p, len);
        if (consumed == 0)
            break;
        assert(consumed <= len);
        p += consumed;
        len -= consumed;
    }

    /*
     * Any data remaining should be copied into our buffer, to keep
     * for next time.
     */
    assert(len <= SCC_BUFSIZE);
    memcpy(scc->buf, p, len);
    scc->buflen = len;

  out:
    setlocale(LC_CTYPE, previous_locale);
    sfree(previous_locale);
}